

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

bool __thiscall crunch::read_only_file_check(crunch *this,char *pDst_filename)

{
  bool bVar1;
  bool bVar2;
  char *p;
  
  bVar1 = crnlib::file_utils::is_read_only(pDst_filename);
  bVar2 = true;
  if (bVar1) {
    bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"forcewrite",0,false);
    if (bVar1) {
      bVar1 = crnlib::file_utils::disable_read_only(pDst_filename);
      if (bVar1) {
        crnlib::console::warning("Setting read-only file \"%s\" to writable",pDst_filename);
        return true;
      }
      p = "Failed setting read-only file \"%s\" to writable!";
    }
    else {
      p = "Output file \"%s\" is read-only!";
    }
    bVar2 = false;
    crnlib::console::error(p,pDst_filename);
  }
  return bVar2;
}

Assistant:

bool read_only_file_check(const char* pDst_filename)
    {
        if (!file_utils::is_read_only(pDst_filename))
        {
            return true;
        }

        if (m_params.get_value_as_bool("forcewrite"))
        {
            if (file_utils::disable_read_only(pDst_filename))
            {
                console::warning("Setting read-only file \"%s\" to writable", pDst_filename);
                return true;
            }
            else
            {
                console::error("Failed setting read-only file \"%s\" to writable!", pDst_filename);
                return false;
            }
        }

        console::error("Output file \"%s\" is read-only!", pDst_filename);

        return false;
    }